

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token)

{
  ushort uVar1;
  ValueHolder *pVVar2;
  ValueHolder VVar3;
  ValueHolder VVar4;
  ValueHolder VVar5;
  _Elt_pointer ppVVar6;
  Location pCVar7;
  bool bVar8;
  _Elt_pointer ppVVar9;
  _Elt_pointer ppVVar10;
  Value decoded;
  Value VStack_68;
  ValueHolder local_40;
  ushort local_38;
  ValueHolder local_28;
  ValueHolder local_20;
  
  VStack_68._8_2_ = VStack_68._8_2_ & 0xfe00;
  VStack_68.comments_ = (CommentInfo *)0x0;
  VStack_68.start_ = 0;
  VStack_68.limit_ = 0;
  bVar8 = decodeNumber(this,token,&VStack_68);
  if (bVar8) {
    Value::Value((Value *)&local_40,&VStack_68);
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar9 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar2 = &ppVVar9[-1]->value_;
    uVar1 = *(ushort *)(pVVar2 + 1);
    *(ushort *)(pVVar2 + 1) = uVar1 & 0xff00 | local_38 & 0xff;
    VVar3 = *pVVar2;
    *pVVar2 = local_40;
    *(ushort *)(pVVar2 + 1) = uVar1 & 0xfe00 | local_38 & 0xff | local_38 & 0x100;
    local_38 = local_38 & 0xfe00 | uVar1 & 0xff | uVar1 & 0x100;
    VVar4 = pVVar2[3];
    pVVar2[3] = local_28;
    VVar5 = pVVar2[4];
    pVVar2[4] = local_20;
    local_40 = VVar3;
    local_28 = VVar4;
    local_20 = VVar5;
    Value::~Value((Value *)&local_40);
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar10 = ppVVar9;
    if (ppVVar9 == ppVVar6) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar7 = this->begin_;
    ppVVar10[-1]->start_ = (long)token->start_ - (long)pCVar7;
    if (ppVVar9 == ppVVar6) {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar9[-1]->limit_ = (long)token->end_ - (long)pCVar7;
  }
  Value::~Value(&VStack_68);
  return bVar8;
}

Assistant:

bool Reader::decodeNumber(Token& token) {
  Value decoded;
  if (!decodeNumber(token, decoded))
    return false;
  currentValue() = decoded;
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}